

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::remove_system_handler(Fl_System_Handler ha)

{
  bool bVar1;
  system_handler_link *local_20;
  system_handler_link *p;
  system_handler_link *l;
  Fl_System_Handler ha_local;
  
  p = sys_handlers;
  local_20 = (system_handler_link *)0x0;
  while( true ) {
    bVar1 = false;
    if (p != (system_handler_link *)0x0) {
      bVar1 = p->handle != ha;
    }
    if (!bVar1) break;
    local_20 = p;
    p = p->next;
  }
  if (p != (system_handler_link *)0x0) {
    if (local_20 == (system_handler_link *)0x0) {
      sys_handlers = p->next;
    }
    else {
      local_20->next = p->next;
    }
    if (p != (system_handler_link *)0x0) {
      operator_delete(p,0x18);
    }
  }
  return;
}

Assistant:

void Fl::remove_system_handler(Fl_System_Handler ha) {
  system_handler_link *l, *p;

  // Search for the handler in the list...
  for (l = sys_handlers, p = 0; l && l->handle != ha; p = l, l = l->next);

  if (l) {
    // Found it, so remove it from the list...
    if (p) p->next = l->next;
    else sys_handlers = l->next;

    // And free the record...
    delete l;
  }
}